

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
multiple_of_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::multiple_of_validator
          (multiple_of_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *schema,
          uri *schema_location,string *custom_message,double value)

{
  allocator<char> local_51;
  double local_50;
  string local_48;
  
  *(undefined ***)&this->field_0xe8 = &PTR__validator_base_009a42b8;
  local_50 = value;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"multipleOf",&local_51);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator(&this->
                       super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ,&PTR_construction_vtable_24__009a5fa0,&local_48,schema,schema_location,
                      custom_message);
  std::__cxx11::string::~string((string *)&local_48);
  (this->
  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ).
  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  .super_validation_message_factory._vptr_validation_message_factory = (_func_int **)0x9a5ed8;
  *(undefined8 *)&this->field_0xe8 = 0x9a5f60;
  *(double *)
   &(this->
    super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ).field_0xe0 = local_50;
  return;
}

Assistant:

multiple_of_validator(const Json& schema, const uri& schema_location, const std::string& custom_message, double value)
            : keyword_validator<Json>("multipleOf", schema, schema_location, custom_message), value_(value)
        {
        }